

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.cpp
# Opt level: O0

void cs_impl::fiber::destroy(routine_t id)

{
  Routine *this;
  vector<cs_impl::fiber::Routine_*,_std::allocator<cs_impl::fiber::Routine_*>_> *pvVar1;
  reference ppRVar2;
  int in_EDI;
  list<unsigned_int,_std::allocator<unsigned_int>_> *unaff_retaddr;
  Routine *routine;
  undefined4 in_stack_fffffffffffffff8;
  
  pvVar1 = (vector<cs_impl::fiber::Routine_*,_std::allocator<cs_impl::fiber::Routine_*>_> *)
           ordinator();
  ppRVar2 = std::vector<cs_impl::fiber::Routine_*,_std::allocator<cs_impl::fiber::Routine_*>_>::
            operator[](pvVar1,(ulong)(in_EDI - 1));
  this = *ppRVar2;
  if (this != (Routine *)0x0) {
    if (this != (Routine *)0x0) {
      Routine::~Routine(this);
      operator_delete(this,0x438);
    }
    pvVar1 = (vector<cs_impl::fiber::Routine_*,_std::allocator<cs_impl::fiber::Routine_*>_> *)
             ordinator();
    ppRVar2 = std::vector<cs_impl::fiber::Routine_*,_std::allocator<cs_impl::fiber::Routine_*>_>::
              operator[](pvVar1,(ulong)(in_EDI - 1));
    *ppRVar2 = (value_type)0x0;
    ordinator();
    std::__cxx11::list<unsigned_int,_std::allocator<unsigned_int>_>::push_back
              (unaff_retaddr,(value_type_conflict2 *)CONCAT44(in_EDI,in_stack_fffffffffffffff8));
    return;
  }
  __assert_fail("routine != nullptr",
                "/workspace/llm4binary/github/license_c_cmakelists/covscript[P]covscript/sources/system/./unix/common.cpp"
                ,0x140,"void cs_impl::fiber::destroy(routine_t)");
}

Assistant:

void destroy(routine_t id)
		{
			Routine *routine = ordinator.routines[id - 1];
			assert(routine != nullptr);

			delete routine;
			ordinator.routines[id - 1] = nullptr;
			ordinator.indexes.push_back(id);
		}